

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O3

IterateResult __thiscall glcts::StateInteractionCase::iterate(StateInteractionCase *this)

{
  ostringstream *poVar1;
  TextureFormat TVar2;
  RenderContext *pRVar3;
  glUniform4fFunc p_Var4;
  glProgramUniform4fFunc p_Var5;
  Functions *pFVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  GLint GVar10;
  GLuint GVar11;
  GLuint GVar12;
  GLenum GVar13;
  GLuint GVar14;
  uint uVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar16;
  MessageBuilder *this_00;
  TestError *pTVar17;
  GLSLVersion glslVersion;
  GLSLVersion extraout_EDX;
  GLSLVersion extraout_EDX_00;
  GLSLVersion glslVersion_00;
  long lVar18;
  void *pvVar19;
  int height;
  GLuint pipeline;
  GLint value;
  Surface renderedFrame;
  char *srcStrings [1];
  string noMain;
  GLuint indexBuf;
  GLuint vertexBuf;
  GLuint vao;
  string frag;
  string vtx;
  string frag2;
  float position [16];
  ProgramSources sources;
  ShaderProgram progVF;
  GLuint local_48c;
  Functions *local_488;
  StateInteractionCase *local_480;
  int local_474;
  Surface local_470;
  TextureFormat local_458;
  TextureFormat local_450;
  long local_448;
  long local_440 [2];
  TextureFormat local_430;
  GLuint local_424;
  GLuint local_420;
  GLuint local_41c;
  string local_418;
  string local_3f8;
  GLuint local_3d4;
  TextureFormat local_3d0;
  TextureFormat local_3c8;
  undefined8 local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  undefined1 local_3a8 [8];
  _Alloc_hider local_3a0;
  undefined1 local_398 [24];
  int local_380;
  VertexArrayPointer local_378;
  value_type local_358;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  Surface local_310;
  Surface local_2f8;
  Surface local_2e0;
  Surface local_2c8;
  Surface local_2b0;
  Surface local_298;
  undefined1 local_280 [8];
  pointer local_278;
  undefined1 local_270 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268 [3];
  ios_base local_208 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1f0;
  undefined1 local_1d0 [208];
  ShaderProgram local_100;
  
  TVar2 = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_488 = (Functions *)CONCAT44(extraout_var,iVar8);
  local_480 = this;
  iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  iVar8 = *(int *)CONCAT44(extraout_var_00,iVar9);
  if (0xf < iVar8) {
    iVar8 = 0x10;
  }
  iVar9 = ((int *)CONCAT44(extraout_var_00,iVar9))[1];
  height = 0x10;
  if (iVar9 < 0x10) {
    height = iVar9;
  }
  tcu::Surface::Surface(&local_470,iVar8,height);
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  local_3f8._M_string_length = 0;
  local_3f8.field_2._M_local_buf[0] = '\0';
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  local_418._M_string_length = 0;
  local_418.field_2._M_local_buf[0] = '\0';
  local_3c8 = (TextureFormat)&local_3b8;
  local_3c0 = 0;
  local_3b8._M_local_buf[0] = '\0';
  local_3d0 = TVar2;
  local_280 = (undefined1  [8])TVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_278);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_278,"Begin:StateInteractionCase iterate",0x22);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_278);
  std::ios_base::~ios_base(local_208);
  pFVar6 = local_488;
  (*local_488->viewport)(0,0,iVar8,height);
  (*pFVar6->clearColor)(0.0,0.0,0.0,0.0);
  (*pFVar6->clear)(0x4000);
  generateBasicVertexSrc_abi_cxx11_
            ((string *)local_280,(glcts *)(ulong)local_480->m_glslVersion,glslVersion);
  std::__cxx11::string::operator=((string *)&local_3f8,(string *)local_280);
  glslVersion_00 = extraout_EDX;
  if (local_280 != (undefined1  [8])local_270) {
    operator_delete((void *)local_280,(long)local_270 + 1);
    glslVersion_00 = extraout_EDX_00;
  }
  generateBasicFragmentSrc_abi_cxx11_
            ((string *)local_280,(glcts *)(ulong)local_480->m_glslVersion,glslVersion_00);
  std::__cxx11::string::operator=((string *)&local_418,(string *)local_280);
  if (local_280 != (undefined1  [8])local_270) {
    operator_delete((void *)local_280,(long)local_270 + 1);
  }
  pRVar3 = ((local_480->super_TestCase).m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3a8,local_3f8._M_dataplus._M_p,(allocator<char> *)&local_450);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_358,local_418._M_dataplus._M_p,(allocator<char> *)&local_430);
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_280,0,0xac);
  local_1d0._0_8_ = (pointer)0x0;
  local_1d0[8] = 0;
  local_1d0._9_7_ = 0;
  local_1d0[0x10] = 0;
  local_1d0._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_280,(value_type *)local_3a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_270 + 8),&local_358);
  glu::ShaderProgram::ShaderProgram(&local_100,pRVar3,(ProgramSources *)local_280);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1d0);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1f0);
  lVar18 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_280 + lVar18));
    lVar18 = lVar18 + -0x18;
  } while (lVar18 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_358._M_dataplus._M_p._4_4_,local_358._M_dataplus._M_p._0_4_) !=
      &local_358.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_358._M_dataplus._M_p._4_4_,local_358._M_dataplus._M_p._0_4_),
                    local_358.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)CONCAT44(local_3a8._4_4_,local_3a8._0_4_) != local_398) {
    operator_delete((undefined1 *)CONCAT44(local_3a8._4_4_,local_3a8._0_4_),local_398._0_8_ + 1);
  }
  (*local_488->useProgram)(local_100.m_program.m_program);
  p_Var4 = local_488->uniform4f;
  GVar10 = (*local_488->getUniformLocation)(local_100.m_program.m_program,"u_color");
  (*p_Var4)(GVar10,0.0,1.0,0.0,1.0);
  (*local_488->genProgramPipelines)(1,&local_48c);
  std::__cxx11::string::_M_assign((string *)&local_3c8);
  uVar16 = std::__cxx11::string::find((char *)&local_3c8,0x1bae3c1,0);
  if (uVar16 != 0xffffffffffffffff) {
    do {
      std::__cxx11::string::replace((ulong)&local_3c8,uVar16,(char *)0x7,0x1af1c70);
      uVar16 = std::__cxx11::string::find((char *)&local_3c8,0x1bae3c1,uVar16 + 7);
    } while (uVar16 != 0xffffffffffffffff);
  }
  pFVar6 = local_488;
  local_458 = (TextureFormat)local_3f8._M_dataplus._M_p;
  GVar11 = (*local_488->createShaderProgramv)(0x8b31,1,(GLchar **)&local_458);
  bVar7 = checkCSProg(local_480,pFVar6,GVar11,1);
  pFVar6 = local_488;
  if (bVar7) {
    local_458 = local_3c8;
    GVar12 = (*local_488->createShaderProgramv)(0x8b30,1,(GLchar **)&local_458);
    bVar7 = checkCSProg(local_480,pFVar6,GVar12,1);
    pFVar6 = local_488;
    if (bVar7) {
      p_Var5 = local_488->programUniform4f;
      GVar10 = (*local_488->getUniformLocation)(GVar12,"u_clrPB");
      (*p_Var5)(GVar12,GVar10,0.0,0.0,1.0,1.0);
      (*pFVar6->useProgramStages)(local_48c,1,GVar11);
      (*pFVar6->useProgramStages)(local_48c,2,GVar12);
      (*pFVar6->bindProgramPipeline)(local_48c);
      local_328 = 0x3f8000003f800000;
      uStack_320 = 0x3f800000bf800000;
      local_338 = 0xbf8000003f800000;
      uStack_330 = 0x3f80000000000000;
      local_358.field_2._M_allocated_capacity = 0x3f800000bf800000;
      local_358.field_2._8_8_ = 0x3f80000000000000;
      local_358._M_dataplus._M_p._0_4_ = 0xbf800000;
      local_358._M_dataplus._M_p._4_4_ = 0xbf800000;
      local_358._M_string_length._0_4_ = 0x3f800000;
      local_358._M_string_length._4_4_ = 0x3f800000;
      local_450 = (TextureFormat)local_440;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"a_position","");
      local_280._0_4_ = A;
      local_278 = (pointer)(local_270 + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_278,local_450,local_448 + (long)local_450);
      local_268[0].field_2._M_allocated_capacity._0_4_ = 0;
      local_3a8._0_4_ = local_280._0_4_;
      local_3a0._M_p = local_398 + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3a0,local_278,
                 (undefined1 *)((long)&(local_278->_M_dataplus)._M_p + (long)local_270));
      local_380 = (undefined4)local_268[0].field_2._M_allocated_capacity;
      local_378.componentType = VTX_COMP_FLOAT;
      local_378.convert = VTX_COMP_CONVERT_NONE;
      local_378.numComponents = 4;
      local_378.numElements = 4;
      local_378.stride = 0;
      local_378.data = &local_358;
      if (local_278 != (pointer)(local_270 + 8)) {
        operator_delete(local_278,(long)local_268[0]._M_dataplus._M_p + 1);
      }
      if (local_450 != (TextureFormat)local_440) {
        operator_delete((void *)local_450,local_440[0] + 1);
      }
      local_280._0_4_ = R;
      local_280._4_4_ = UNORM_INT32;
      local_278 = (pointer)CONCAT44(local_278._4_4_,1);
      local_270 = (undefined1  [8])iterate::quadIndices;
      glu::draw(((local_480->super_TestCase).m_context)->m_renderCtx,local_100.m_program.m_program,1
                ,(VertexArrayBinding *)local_3a8,(PrimitiveList *)local_280,(DrawUtilCallback *)0x0)
      ;
      GVar13 = (*local_488->getError)();
      glu::checkError(GVar13,"StateInteraction glu::draw failure",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                      ,0x8c3);
      pRVar3 = ((local_480->super_TestCase).m_context)->m_renderCtx;
      local_450.order = RGBA;
      local_450.type = UNORM_INT8;
      pvVar19 = (void *)local_470.m_pixels.m_cap;
      if ((void *)local_470.m_pixels.m_cap != (void *)0x0) {
        pvVar19 = local_470.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_280,&local_450,local_470.m_width,local_470.m_height,1,
                 pvVar19);
      glu::readPixels(pRVar3,0,0,(PixelBufferAccess *)local_280);
      de::ArrayBuffer<unsigned_int,_4UL,_4UL>::ArrayBuffer(&local_298.m_pixels,&local_470.m_pixels);
      bVar7 = checkSurface(local_480,&local_298,(RGBA)0xff00ff00);
      tcu::Surface::~Surface(&local_298);
      pFVar6 = local_488;
      if (!bVar7) {
        pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar17,"StateInteraction failed; surface should be green",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                   ,0x8ca);
        __cxa_throw(pTVar17,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      GVar14 = (*local_488->getAttribLocation)(local_100.m_program.m_program,"a_position");
      uVar15 = (*((local_480->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
      if ((uVar15 & 0x300) == 0) {
        (*pFVar6->disableVertexAttribArray)(GVar14);
      }
      (*pFVar6->genVertexArrays)(1,&local_41c);
      (*pFVar6->bindVertexArray)(local_41c);
      (*pFVar6->genBuffers)(1,&local_424);
      (*pFVar6->bindBuffer)(0x8893,local_424);
      (*pFVar6->bufferData)(0x8893,0xc,iterate::quadIndices,0x88e4);
      (*pFVar6->genBuffers)(1,&local_420);
      (*pFVar6->bindBuffer)(0x8892,local_420);
      (*pFVar6->bufferData)(0x8892,0x40,&local_358,0x88e4);
      GVar14 = (*pFVar6->getAttribLocation)(GVar11,"a_position");
      (*pFVar6->vertexAttribPointer)(GVar14,4,0x1406,'\0',0,(void *)0x0);
      (*pFVar6->enableVertexAttribArray)(GVar14);
      (*pFVar6->bindBuffer)(0x8892,0);
      GVar13 = (*pFVar6->getError)();
      glu::checkError(GVar13,"VAO setup failure",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                      ,0x8e4);
      (*pFVar6->useProgram)(0);
      (*pFVar6->bindProgramPipeline)(local_48c);
      (*pFVar6->drawElements)(4,6,0x1403,(void *)0x0);
      GVar13 = (*pFVar6->getError)();
      glu::checkError(GVar13,"DrawElements failure",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                      ,0x8ed);
      pRVar3 = ((local_480->super_TestCase).m_context)->m_renderCtx;
      local_450.order = RGBA;
      local_450.type = UNORM_INT8;
      pvVar19 = (void *)local_470.m_pixels.m_cap;
      if ((void *)local_470.m_pixels.m_cap != (void *)0x0) {
        pvVar19 = local_470.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_280,&local_450,local_470.m_width,local_470.m_height,1,
                 pvVar19);
      glu::readPixels(pRVar3,0,0,(PixelBufferAccess *)local_280);
      de::ArrayBuffer<unsigned_int,_4UL,_4UL>::ArrayBuffer(&local_2b0.m_pixels,&local_470.m_pixels);
      bVar7 = checkSurface(local_480,&local_2b0,(RGBA)0xffff0000);
      tcu::Surface::~Surface(&local_2b0);
      pFVar6 = local_488;
      if (bVar7) {
        (*local_488->useProgram)(0);
        (*pFVar6->bindProgramPipeline)(0);
        (*pFVar6->drawElements)(4,6,0x1403,(void *)0x0);
        GVar13 = (*pFVar6->getError)();
        glu::checkError(GVar13,"DrawElements failure",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                        ,0x8fd);
        (*pFVar6->useProgramStages)(local_48c,1,0);
        (*pFVar6->useProgramStages)(local_48c,2,GVar12);
        (*pFVar6->bindProgramPipeline)(local_48c);
        (*pFVar6->drawElements)(4,6,0x1403,(void *)0x0);
        GVar13 = (*pFVar6->getError)();
        glu::checkError(GVar13,"DrawElements failure",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                        ,0x905);
        (*pFVar6->useProgramStages)(local_48c,1,GVar11);
        (*pFVar6->useProgramStages)(local_48c,2,0);
        (*pFVar6->drawElements)(4,6,0x1403,(void *)0x0);
        GVar13 = (*pFVar6->getError)();
        glu::checkError(GVar13,"DrawElements failure",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                        ,0x90b);
        (*pFVar6->useProgramStages)(local_48c,3,GVar11);
        (*pFVar6->drawElements)(4,6,0x1403,(void *)0x0);
        GVar13 = (*pFVar6->getError)();
        glu::checkError(GVar13,"DrawElements failure",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                        ,0x911);
        (*pFVar6->programParameteri)(local_100.m_program.m_program,0x8258,1);
        (*pFVar6->linkProgram)(local_100.m_program.m_program);
        (*pFVar6->useProgramStages)(local_48c,1,local_100.m_program.m_program);
        (*pFVar6->drawElements)(4,6,0x1403,(void *)0x0);
        GVar13 = (*pFVar6->getError)();
        pFVar6 = local_488;
        if (GVar13 == 0x502) {
          (*local_488->validateProgramPipeline)(local_48c);
          (*pFVar6->getProgramPipelineiv)(local_48c,0x8b83,&local_474);
          pFVar6 = local_488;
          if (local_474 == 0) {
            (*local_488->useProgramStages)(local_48c,1,0);
            (*pFVar6->useProgramStages)(local_48c,2,local_100.m_program.m_program);
            (*pFVar6->validateProgramPipeline)(local_48c);
            (*pFVar6->getProgramPipelineiv)(local_48c,0x8b83,&local_474);
            pFVar6 = local_488;
            if (local_474 == 0) {
              (*local_488->drawElements)(4,6,0x1403,(void *)0x0);
              GVar13 = (*pFVar6->getError)();
              pFVar6 = local_488;
              if (GVar13 == 0x502) {
                (*local_488->useProgramStages)(local_48c,1,GVar11);
                (*pFVar6->useProgramStages)(local_48c,2,GVar12);
                p_Var5 = pFVar6->programUniform4f;
                GVar10 = (*pFVar6->getUniformLocation)(GVar12,"u_clrPB");
                (*p_Var5)(GVar12,GVar10,1.0,0.0,0.0,1.0);
                (*pFVar6->deleteProgram)(GVar12);
                (*pFVar6->drawElements)(4,6,0x1403,(void *)0x0);
                pRVar3 = ((local_480->super_TestCase).m_context)->m_renderCtx;
                local_450.order = RGBA;
                local_450.type = UNORM_INT8;
                pvVar19 = (void *)local_470.m_pixels.m_cap;
                if ((void *)local_470.m_pixels.m_cap != (void *)0x0) {
                  pvVar19 = local_470.m_pixels.m_ptr;
                }
                tcu::PixelBufferAccess::PixelBufferAccess
                          ((PixelBufferAccess *)local_280,&local_450,local_470.m_width,
                           local_470.m_height,1,pvVar19);
                glu::readPixels(pRVar3,0,0,(PixelBufferAccess *)local_280);
                de::ArrayBuffer<unsigned_int,_4UL,_4UL>::ArrayBuffer
                          (&local_2c8.m_pixels,&local_470.m_pixels);
                bVar7 = checkSurface(local_480,&local_2c8,(RGBA)0xff0000ff);
                tcu::Surface::~Surface(&local_2c8);
                pFVar6 = local_488;
                if (bVar7) {
                  local_458 = local_3c8;
                  GVar12 = (*local_488->createShaderProgramv)(0x8b30,1,(GLchar **)&local_458);
                  bVar7 = checkCSProg(local_480,pFVar6,GVar12,1);
                  pFVar6 = local_488;
                  if (bVar7) {
                    p_Var5 = local_488->programUniform4f;
                    GVar10 = (*local_488->getUniformLocation)(GVar12,"u_clrPB");
                    (*p_Var5)(GVar12,GVar10,0.0,1.0,0.0,1.0);
                    (*pFVar6->useProgramStages)(local_48c,2,GVar12);
                    GVar14 = (*pFVar6->createShader)(0x8b30);
                    local_458 = (TextureFormat)local_418._M_dataplus._M_p;
                    (*local_488->shaderSource)(GVar14,1,(GLchar **)&local_458,(GLint *)0x0);
                    (*local_488->compileShader)(GVar14);
                    (*local_488->getShaderiv)(GVar14,0x8b81,&local_474);
                    (*local_488->attachShader)(GVar12,GVar14);
                    (*local_488->getProgramiv)(GVar12,0x8b82,&local_474);
                    if (local_474 == 1) {
                      (*local_488->drawElements)(4,6,0x1403,(void *)0x0);
                      GVar13 = (*local_488->getError)();
                      glu::checkError(GVar13,"DrawElements failure",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                      ,0x969);
                      pRVar3 = ((local_480->super_TestCase).m_context)->m_renderCtx;
                      local_450.order = RGBA;
                      local_450.type = UNORM_INT8;
                      pvVar19 = (void *)local_470.m_pixels.m_cap;
                      if ((void *)local_470.m_pixels.m_cap != (void *)0x0) {
                        pvVar19 = local_470.m_pixels.m_ptr;
                      }
                      tcu::PixelBufferAccess::PixelBufferAccess
                                ((PixelBufferAccess *)local_280,&local_450,local_470.m_width,
                                 local_470.m_height,1,pvVar19);
                      glu::readPixels(pRVar3,0,0,(PixelBufferAccess *)local_280);
                      de::ArrayBuffer<unsigned_int,_4UL,_4UL>::ArrayBuffer
                                (&local_2e0.m_pixels,&local_470.m_pixels);
                      bVar7 = checkSurface(local_480,&local_2e0,(RGBA)0xff00ff00);
                      tcu::Surface::~Surface(&local_2e0);
                      if (bVar7) {
                        p_Var5 = local_488->programUniform4f;
                        GVar10 = (*local_488->getUniformLocation)(GVar12,"u_clrPB");
                        (*p_Var5)(GVar12,GVar10,1.0,1.0,1.0,1.0);
                        local_450 = (TextureFormat)local_440;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&local_450,local_418._M_dataplus._M_p,
                                   local_418._M_string_length + local_418._M_dataplus._M_p);
                        uVar16 = std::__cxx11::string::find((char *)&local_450,0x1af0218,0);
                        std::__cxx11::string::replace
                                  ((ulong)&local_450,uVar16,&DAT_00000004,0x1af021d);
                        pFVar6 = local_488;
                        local_458 = local_450;
                        (*local_488->shaderSource)(GVar14,1,(GLchar **)&local_458,(GLint *)0x0);
                        (*pFVar6->compileShader)(GVar14);
                        (*pFVar6->getShaderiv)(GVar14,0x8b81,&local_474);
                        (*pFVar6->attachShader)(GVar12,GVar14);
                        (*pFVar6->linkProgram)(GVar12);
                        (*pFVar6->getError)();
                        (*pFVar6->getProgramiv)(GVar12,0x8b82,&local_474);
                        if (local_474 == 0) {
                          (*local_488->drawElements)(4,6,0x1403,(void *)0x0);
                          pRVar3 = ((local_480->super_TestCase).m_context)->m_renderCtx;
                          local_430.order = RGBA;
                          local_430.type = UNORM_INT8;
                          pvVar19 = (void *)local_470.m_pixels.m_cap;
                          if ((void *)local_470.m_pixels.m_cap != (void *)0x0) {
                            pvVar19 = local_470.m_pixels.m_ptr;
                          }
                          tcu::PixelBufferAccess::PixelBufferAccess
                                    ((PixelBufferAccess *)local_280,&local_430,local_470.m_width,
                                     local_470.m_height,1,pvVar19);
                          glu::readPixels(pRVar3,0,0,(PixelBufferAccess *)local_280);
                          de::ArrayBuffer<unsigned_int,_4UL,_4UL>::ArrayBuffer
                                    (&local_2f8.m_pixels,&local_470.m_pixels);
                          bVar7 = checkSurface(local_480,&local_2f8,(RGBA)0xffffffff);
                          tcu::Surface::~Surface(&local_2f8);
                          pFVar6 = local_488;
                          if (bVar7) {
                            (*local_488->deleteProgram)(GVar11);
                            (*pFVar6->deleteProgram)(GVar12);
                            iVar8 = 0;
                            local_3d4 = GVar14;
                            do {
                              iVar9 = 0;
                              do {
                                generateVarLinkVertexShaderSrc
                                          (local_480,&local_3f8,local_480->m_glslVersion,iVar9);
                                generateVarLinkFragmentShaderSrc
                                          (local_480,&local_418,local_480->m_glslVersion,iVar8);
                                local_458 = (TextureFormat)local_3f8._M_dataplus._M_p;
                                GVar11 = (*local_488->createShaderProgramv)
                                                   (0x8b31,1,(GLchar **)&local_458);
                                bVar7 = checkCSProg(local_480,local_488,GVar11,1);
                                if (!bVar7) {
                                  pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
                                  tcu::TestError::TestError
                                            (pTVar17,"CreateShaderProgramv failed for vertex shader"
                                             ,(char *)0x0,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                             ,0x9a6);
LAB_00beea1e:
                                  __cxa_throw(pTVar17,&tcu::TestError::typeinfo,
                                              tcu::Exception::~Exception);
                                }
                                local_458 = (TextureFormat)local_418._M_dataplus._M_p;
                                GVar12 = (*local_488->createShaderProgramv)
                                                   (0x8b30,1,(GLchar **)&local_458);
                                bVar7 = checkCSProg(local_480,local_488,GVar12,1);
                                if (!bVar7) {
                                  pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
                                  tcu::TestError::TestError
                                            (pTVar17,
                                             "CreateShaderProgramv failed for fragment shader",
                                             (char *)0x0,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                             ,0x9ad);
                                  goto LAB_00beea1e;
                                }
                                (*local_488->useProgramStages)(local_48c,1,GVar11);
                                (*local_488->useProgramStages)(local_48c,2,GVar12);
                                GVar13 = (*local_488->getError)();
                                glu::checkError(GVar13,"UseProgramStages failure",
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                                ,0x9b2);
                                (*local_488->validateProgramPipeline)(local_48c);
                                (*local_488->getProgramPipelineiv)(local_48c,0x8b83,&local_474);
                                if (iVar8 == iVar9) {
                                  if (local_474 != 1) {
                                    local_280._0_4_ = local_3d0.order;
                                    local_280._4_4_ = local_3d0.type;
                                    std::__cxx11::ostringstream::ostringstream
                                              ((ostringstream *)&local_278);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&local_278,
                                               "Matched input and output variables should validate successfully.\n"
                                               ,0x41);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&local_278,"Vertex Shader:\n",0xf);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&local_278,local_3f8._M_dataplus._M_p,
                                               local_3f8._M_string_length);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&local_278,"Fragment Shader:\n",0x11);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&local_278,local_418._M_dataplus._M_p,
                                               local_418._M_string_length);
                                    tcu::MessageBuilder::operator<<
                                              ((MessageBuilder *)local_280,
                                               (EndMessageToken *)&tcu::TestLog::EndMessage);
                                    std::__cxx11::ostringstream::~ostringstream
                                              ((ostringstream *)&local_278);
                                    std::ios_base::~ios_base(local_208);
                                    pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
                                    tcu::TestError::TestError
                                              (pTVar17,"StateInteraction failed",(char *)0x0,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                               ,0x9c0);
                                    goto LAB_00beea1e;
                                  }
                                  (*local_488->clear)(0x4000);
                                  p_Var5 = local_488->programUniform4f;
                                  GVar10 = (*local_488->getUniformLocation)(GVar11,"u_color");
                                  (*p_Var5)(GVar11,GVar10,1.0,1.0,1.0,1.0);
                                  (*local_488->drawElements)(4,6,0x1403,(void *)0x0);
                                  GVar13 = (*local_488->getError)();
                                  glu::checkError(GVar13,"DrawElements failure",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                                  ,0x9c6);
                                  pRVar3 = ((local_480->super_TestCase).m_context)->m_renderCtx;
                                  local_430.order = RGBA;
                                  local_430.type = UNORM_INT8;
                                  pvVar19 = (void *)local_470.m_pixels.m_cap;
                                  if ((void *)local_470.m_pixels.m_cap != (void *)0x0) {
                                    pvVar19 = local_470.m_pixels.m_ptr;
                                  }
                                  tcu::PixelBufferAccess::PixelBufferAccess
                                            ((PixelBufferAccess *)local_280,&local_430,
                                             local_470.m_width,local_470.m_height,1,pvVar19);
                                  glu::readPixels(pRVar3,0,0,(PixelBufferAccess *)local_280);
                                  de::ArrayBuffer<unsigned_int,_4UL,_4UL>::ArrayBuffer
                                            (&local_310.m_pixels,&local_470.m_pixels);
                                  bVar7 = checkSurface(local_480,&local_310,(RGBA)0xffffffff);
                                  tcu::Surface::~Surface(&local_310);
                                  if (!bVar7) {
                                    pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
                                    tcu::TestError::TestError
                                              (pTVar17,
                                               "StateInteraction failed; surface should be white",
                                               (char *)0x0,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                               ,0x9cd);
                                    goto LAB_00beea1e;
                                  }
                                }
                                else {
                                  uVar15 = (*((local_480->super_TestCase).m_context)->m_renderCtx->
                                             _vptr_RenderContext[2])();
                                  if ((local_474 != 0) == ((uVar15 & 0x300) == 0)) {
                                    local_280._0_4_ = local_3d0.order;
                                    local_280._4_4_ = local_3d0.type;
                                    std::__cxx11::ostringstream::ostringstream
                                              ((ostringstream *)&local_278);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&local_278,
                                               "Mismatched input and output variables; validation should "
                                               ,0x39);
                                    uVar15 = (*((local_480->super_TestCase).m_context)->m_renderCtx
                                               ->_vptr_RenderContext[2])();
                                    local_430 = (TextureFormat)0x1af1ebc;
                                    if ((uVar15 & 0x300) == 0) {
                                      local_430 = (TextureFormat)
                                                  ((long)"Compilation should fail.\n" + 0x13);
                                    }
                                    this_00 = tcu::MessageBuilder::operator<<
                                                        ((MessageBuilder *)local_280,
                                                         (char **)&local_430);
                                    poVar1 = &this_00->m_str;
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              (&poVar1->
                                                super_basic_ostream<char,_std::char_traits<char>_>,
                                               "Vertex Shader:\n",0xf);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              (&poVar1->
                                                super_basic_ostream<char,_std::char_traits<char>_>,
                                               local_3f8._M_dataplus._M_p,local_3f8._M_string_length
                                              );
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              (&poVar1->
                                                super_basic_ostream<char,_std::char_traits<char>_>,
                                               "Fragment Shader:\n",0x11);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              (&poVar1->
                                                super_basic_ostream<char,_std::char_traits<char>_>,
                                               local_418._M_dataplus._M_p,local_418._M_string_length
                                              );
                                    tcu::MessageBuilder::operator<<
                                              (this_00,(EndMessageToken *)&tcu::TestLog::EndMessage)
                                    ;
                                    std::__cxx11::ostringstream::~ostringstream
                                              ((ostringstream *)&local_278);
                                    std::ios_base::~ios_base(local_208);
                                    pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
                                    tcu::TestError::TestError
                                              (pTVar17,"StateInteraction failed",(char *)0x0,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                               ,0x9dc);
                                    goto LAB_00beea1e;
                                  }
                                }
                                (*local_488->deleteProgram)(GVar11);
                                (*local_488->deleteProgram)(GVar12);
                                pFVar6 = local_488;
                                iVar9 = iVar9 + 1;
                              } while (iVar9 != 6);
                              iVar8 = iVar8 + 1;
                              if (iVar8 == 6) {
                                (*local_488->bindProgramPipeline)(0);
                                (*pFVar6->bindVertexArray)(0);
                                (*pFVar6->deleteProgramPipelines)(1,&local_48c);
                                (*pFVar6->deleteShader)(local_3d4);
                                (*pFVar6->deleteVertexArrays)(1,&local_41c);
                                (*pFVar6->deleteBuffers)(1,&local_424);
                                (*pFVar6->deleteBuffers)(1,&local_420);
                                tcu::TestContext::setTestResult
                                          ((local_480->super_TestCase).super_TestCase.super_TestNode
                                           .m_testCtx,QP_TEST_RESULT_PASS,"Pass");
                                if (local_450 != (TextureFormat)local_440) {
                                  operator_delete((void *)local_450,local_440[0] + 1);
                                }
                                if (local_3a0._M_p != local_398 + 8) {
                                  operator_delete(local_3a0._M_p,local_398._8_8_ + 1);
                                }
                                glu::ShaderProgram::~ShaderProgram(&local_100);
                                if (local_3c8 != (TextureFormat)&local_3b8) {
                                  operator_delete((void *)local_3c8,
                                                  CONCAT71(local_3b8._M_allocated_capacity._1_7_,
                                                           local_3b8._M_local_buf[0]) + 1);
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_418._M_dataplus._M_p != &local_418.field_2) {
                                  operator_delete(local_418._M_dataplus._M_p,
                                                  CONCAT71(local_418.field_2._M_allocated_capacity.
                                                           _1_7_,local_418.field_2._M_local_buf[0])
                                                  + 1);
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
                                  operator_delete(local_3f8._M_dataplus._M_p,
                                                  CONCAT71(local_3f8.field_2._M_allocated_capacity.
                                                           _1_7_,local_3f8.field_2._M_local_buf[0])
                                                  + 1);
                                }
                                tcu::Surface::~Surface(&local_470);
                                return STOP;
                              }
                            } while( true );
                          }
                          pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
                          tcu::TestError::TestError
                                    (pTVar17,"StateInteraction failed; surface should be white",
                                     (char *)0x0,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                     ,0x991);
                        }
                        else {
                          pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
                          tcu::TestError::TestError
                                    (pTVar17,"StateInteraction failed; link failure",(char *)0x0,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                     ,0x987);
                        }
                        __cxa_throw(pTVar17,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
                      }
                      pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
                      tcu::TestError::TestError
                                (pTVar17,"StateInteraction failed; surface should be green",
                                 (char *)0x0,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                 ,0x970);
                    }
                    else {
                      pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
                      tcu::TestError::TestError
                                (pTVar17,"Shader attachment shouldn\'t affect link status",
                                 (char *)0x0,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                 ,0x965);
                    }
                    __cxa_throw(pTVar17,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
                  }
                  pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
                  tcu::TestError::TestError
                            (pTVar17,"CreateShaderProgramv failed for fragment shader",(char *)0x0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                             ,0x952);
                }
                else {
                  pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
                  tcu::TestError::TestError
                            (pTVar17,"StateInteraction failed; surface should be red",(char *)0x0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                             ,0x94a);
                }
              }
              else {
                pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (pTVar17,"DrawElements failed",(char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                           ,0x938);
              }
            }
            else {
              pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar17,"Program pipeline validation failed",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                         ,0x931);
            }
          }
          else {
            pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar17,"Program pipeline validation failed",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                       ,0x925);
          }
          __cxa_throw(pTVar17,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar17,"DrawElements failed",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                   ,0x91d);
      }
      else {
        pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar17,"StateInteraction failed; surface should be blue",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                   ,0x8f4);
      }
      __cxa_throw(pTVar17,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar17,"CreateShaderProgramv failed for fragment shader",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x8b3);
  }
  else {
    pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar17,"CreateShaderProgramv failed for vertex shader",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x8ad);
  }
  __cxa_throw(pTVar17,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate(void)
	{
		TestLog&				 log		  = m_testCtx.getLog();
		const glw::Functions&	gl			  = m_context.getRenderContext().getFunctions();
		const tcu::RenderTarget& renderTarget = m_context.getRenderContext().getRenderTarget();
		int						 viewportW	= de::min(16, renderTarget.getWidth());
		int						 viewportH	= de::min(16, renderTarget.getHeight());
		tcu::Surface			 renderedFrame(viewportW, viewportH);

		glw::GLuint programA, programB;
		glw::GLuint vao, vertexBuf, indexBuf;
		std::string vtx;
		std::string frag, frag2;
		glw::GLuint pipeline;
		const char* srcStrings[1];
		glw::GLenum err;

		log << TestLog::Message << "Begin:StateInteractionCase iterate" << TestLog::EndMessage;

		gl.viewport(0, 0, viewportW, viewportH);
		gl.clearColor(0.0f, 0.0f, 0.0f, 0.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);

		// Check the precedence of glUseProgram over glBindProgramPipeline
		// The program bound with glUseProgram will draw green, the programs
		// bound with glBindProgramPipeline will render blue.
		vtx  = generateBasicVertexSrc(m_glslVersion);
		frag = generateBasicFragmentSrc(m_glslVersion);

		glu::ShaderProgram progVF(m_context.getRenderContext(), glu::makeVtxFragSources(vtx.c_str(), frag.c_str()));

		gl.useProgram(progVF.getProgram());
		// Ouput green in the fragment shader
		gl.uniform4f(gl.getUniformLocation(progVF.getProgram(), "u_color"), 0.0f, 1.0f, 0.0f, 1.0f);

		// Create and bind a pipeline with a different fragment shader
		gl.genProgramPipelines(1, &pipeline);
		// Use a different uniform name in another fragment shader
		frag2	  = frag;
		size_t pos = 0;
		while ((pos = frag2.find("u_color", pos)) != std::string::npos)
		{
			frag2.replace(pos, 7, "u_clrPB");
			pos += 7;
		}

		srcStrings[0] = vtx.c_str();
		programA	  = gl.createShaderProgramv(GL_VERTEX_SHADER, 1, srcStrings);
		if (!checkCSProg(gl, programA))
		{
			TCU_FAIL("CreateShaderProgramv failed for vertex shader");
		}
		srcStrings[0] = frag2.c_str();
		programB	  = gl.createShaderProgramv(GL_FRAGMENT_SHADER, 1, srcStrings);
		if (!checkCSProg(gl, programB))
		{
			TCU_FAIL("CreateShaderProgramv failed for fragment shader");
		}
		// Program B outputs blue.
		gl.programUniform4f(programB, gl.getUniformLocation(programB, "u_clrPB"), 0.0f, 0.0f, 1.0f, 1.0f);
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT, programA);
		gl.useProgramStages(pipeline, GL_FRAGMENT_SHADER_BIT, programB);
		gl.bindProgramPipeline(pipeline);

		static const deUint16 quadIndices[] = { 0, 1, 2, 2, 1, 3 };
		const float			  position[]	= { -1.0f, -1.0f, +1.0f, 1.0f, -1.0f, +1.0f, 0.0f,  1.0f,
								   +1.0f, -1.0f, 0.0f,  1.0f, +1.0f, +1.0f, -1.0f, 1.0f };

		// Draw a quad with glu::draw
		glu::VertexArrayBinding posArray = glu::va::Float("a_position", 4, 4, 0, &position[0]);
		glu::draw(m_context.getRenderContext(), progVF.getProgram(), 1, &posArray,
				  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "StateInteraction glu::draw failure");

		glu::readPixels(m_context.getRenderContext(), 0, 0, renderedFrame.getAccess());

		// useProgram takes precedence and the buffer should be green
		if (!checkSurface(renderedFrame, tcu::RGBA::green()))
		{
			TCU_FAIL("StateInteraction failed; surface should be green");
		}

		// The position attribute locations may be different.
		int posLoc = gl.getAttribLocation(progVF.getProgram(), "a_position");

		if (glu::isContextTypeES(m_context.getRenderContext().getType()))
			gl.disableVertexAttribArray(posLoc);

		/* Set up a vertex array object */
		gl.genVertexArrays(1, &vao);
		gl.bindVertexArray(vao);

		gl.genBuffers(1, &indexBuf);
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, indexBuf);
		gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(quadIndices), quadIndices, GL_STATIC_DRAW);

		gl.genBuffers(1, &vertexBuf);
		gl.bindBuffer(GL_ARRAY_BUFFER, vertexBuf);
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(position), position, GL_STATIC_DRAW);

		posLoc = gl.getAttribLocation(programA, "a_position");
		gl.vertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, 0);
		gl.enableVertexAttribArray(posLoc);
		gl.bindBuffer(GL_ARRAY_BUFFER, 0);

		GLU_EXPECT_NO_ERROR(gl.getError(), "VAO setup failure");

		// bindProgramPipeline without a program installed by useProgram
		// Rerender the quad.  Don't use glu::draw because it takes the
		// program as a parameter and sets state.
		gl.useProgram(0);
		gl.bindProgramPipeline(pipeline);

		gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawElements failure");

		glu::readPixels(m_context.getRenderContext(), 0, 0, renderedFrame.getAccess());

		// bindProgramPipeline will render blue
		if (!checkSurface(renderedFrame, tcu::RGBA::blue()))
		{
			TCU_FAIL("StateInteraction failed; surface should be blue");
		}

		// Test rendering with no program bound.  Rendering is undefined
		// but shouldn't produce an error.
		gl.useProgram(0);
		gl.bindProgramPipeline(0);

		gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawElements failure");

		// Render call with missing pipeline stages should not generate an error
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT, 0);
		gl.useProgramStages(pipeline, GL_FRAGMENT_SHADER_BIT, programB);
		gl.bindProgramPipeline(pipeline);

		gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawElements failure");

		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT, programA);
		gl.useProgramStages(pipeline, GL_FRAGMENT_SHADER_BIT, 0);

		gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawElements failure");

		// Missing program for fragment shader
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT | GL_FRAGMENT_SHADER_BIT, programA);

		gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawElements failure");

		// Separable program with both vertex and fragment shaders attached to only one stage

		gl.programParameteri(progVF.getProgram(), GL_PROGRAM_SEPARABLE, GL_TRUE);
		gl.linkProgram(progVF.getProgram());
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT, progVF.getProgram());

		gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);
		err = gl.getError();
		if (err != GL_INVALID_OPERATION)
		{
			TCU_FAIL("DrawElements failed");
		}

		gl.validateProgramPipeline(pipeline);
		glw::GLint value;
		gl.getProgramPipelineiv(pipeline, GL_VALIDATE_STATUS, (glw::GLint*)&value);
		if (value != 0)
		{
			TCU_FAIL("Program pipeline validation failed");
		}

		// attached to just the fragment shader
		// Call validateProgramPipeline before rendering this time
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT, 0);
		gl.useProgramStages(pipeline, GL_FRAGMENT_SHADER_BIT, progVF.getProgram());

		gl.validateProgramPipeline(pipeline);
		gl.getProgramPipelineiv(pipeline, GL_VALIDATE_STATUS, (glw::GLint*)&value);
		if (value != 0)
		{
			TCU_FAIL("Program pipeline validation failed");
		}

		gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);
		err = gl.getError();
		if (err != GL_INVALID_OPERATION)
		{
			TCU_FAIL("DrawElements failed");
		}

		// Program deletion
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT, programA);
		gl.useProgramStages(pipeline, GL_FRAGMENT_SHADER_BIT, programB);

		// Program B renders red this time
		gl.programUniform4f(programB, gl.getUniformLocation(programB, "u_clrPB"), 1.0f, 0.0f, 0.0f, 1.0f);

		gl.deleteProgram(programB);

		gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);
		glu::readPixels(m_context.getRenderContext(), 0, 0, renderedFrame.getAccess());

		// expect red
		if (!checkSurface(renderedFrame, tcu::RGBA::red()))
		{
			TCU_FAIL("StateInteraction failed; surface should be red");
		}

		// Attach new shader
		srcStrings[0] = frag2.c_str();
		programB	  = gl.createShaderProgramv(GL_FRAGMENT_SHADER, 1, srcStrings);
		if (!checkCSProg(gl, programB))
		{
			TCU_FAIL("CreateShaderProgramv failed for fragment shader");
		}
		// Render green
		gl.programUniform4f(programB, gl.getUniformLocation(programB, "u_clrPB"), 0.0f, 1.0f, 0.0f, 1.0f);
		gl.useProgramStages(pipeline, GL_FRAGMENT_SHADER_BIT, programB);

		// new shader
		glw::GLuint vshader = gl.createShader(GL_FRAGMENT_SHADER);
		srcStrings[0]		= frag.c_str(); // First frag shader with u_color uniform
		gl.shaderSource(vshader, 1, srcStrings, NULL);
		gl.compileShader(vshader);
		gl.getShaderiv(vshader, GL_COMPILE_STATUS, &value);
		DE_ASSERT(value == GL_TRUE);
		gl.attachShader(programB, vshader);

		// changing shader shouldn't affect link_status
		gl.getProgramiv(programB, GL_LINK_STATUS, &value);
		if (value != 1)
		{
			TCU_FAIL("Shader attachment shouldn't affect link status");
		}

		gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawElements failure");

		glu::readPixels(m_context.getRenderContext(), 0, 0, renderedFrame.getAccess());

		// expect green
		if (!checkSurface(renderedFrame, tcu::RGBA::green()))
		{
			TCU_FAIL("StateInteraction failed; surface should be green");
		}

		// Negative Case: Unsuccessfully linked program should not affect current program

		// Render white
		gl.programUniform4f(programB, gl.getUniformLocation(programB, "u_clrPB"), 1.0f, 1.0f, 1.0f, 1.0f);
		std::string noMain = frag;
		pos				   = noMain.find("main", 0);
		noMain.replace(pos, 4, "niaM");

		srcStrings[0] = noMain.c_str();
		gl.shaderSource(vshader, 1, srcStrings, NULL);
		gl.compileShader(vshader);
		gl.getShaderiv(vshader, GL_COMPILE_STATUS, &value);
		gl.attachShader(programB, vshader);
		gl.linkProgram(programB);
		err = gl.getError();

		// link_status should be false
		gl.getProgramiv(programB, GL_LINK_STATUS, &value);
		if (value != 0)
		{
			TCU_FAIL("StateInteraction failed; link failure");
		}

		gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);

		glu::readPixels(m_context.getRenderContext(), 0, 0, renderedFrame.getAccess());

		// expect white
		if (!checkSurface(renderedFrame, tcu::RGBA::white()))
		{
			TCU_FAIL("StateInteraction failed; surface should be white");
		}

		gl.deleteProgram(programA);
		gl.deleteProgram(programB);

		// Shader interface matching inputs/outputs

		int maxVars = 6; // generate code supports 6 variables
		for (int numInputs = 0; numInputs < maxVars; numInputs++)
		{
			for (int numOutputs = 0; numOutputs < maxVars; numOutputs++)
			{

				generateVarLinkVertexShaderSrc(vtx, m_glslVersion, numOutputs);
				generateVarLinkFragmentShaderSrc(frag, m_glslVersion, numInputs);

				srcStrings[0] = vtx.c_str();
				programA	  = gl.createShaderProgramv(GL_VERTEX_SHADER, 1, srcStrings);
				if (!checkCSProg(gl, programA))
				{
					TCU_FAIL("CreateShaderProgramv failed for vertex shader");
				}

				srcStrings[0] = frag.c_str();
				programB	  = gl.createShaderProgramv(GL_FRAGMENT_SHADER, 1, srcStrings);
				if (!checkCSProg(gl, programB))
				{
					TCU_FAIL("CreateShaderProgramv failed for fragment shader");
				}

				gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT, programA);
				gl.useProgramStages(pipeline, GL_FRAGMENT_SHADER_BIT, programB);
				GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgramStages failure");

				gl.validateProgramPipeline(pipeline);
				gl.getProgramPipelineiv(pipeline, GL_VALIDATE_STATUS, (glw::GLint*)&value);

				// Matched input and output variables should render
				if (numInputs == numOutputs)
				{
					if (value != 1)
					{
						log << TestLog::Message << "Matched input and output variables should validate successfully.\n"
							<< "Vertex Shader:\n"
							<< vtx << "Fragment Shader:\n"
							<< frag << TestLog::EndMessage;
						TCU_FAIL("StateInteraction failed");
					}
					gl.clear(GL_COLOR_BUFFER_BIT);
					// white
					gl.programUniform4f(programA, gl.getUniformLocation(programA, "u_color"), 1.0f, 1.0f, 1.0f, 1.0f);
					gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);
					GLU_EXPECT_NO_ERROR(gl.getError(), "DrawElements failure");

					glu::readPixels(m_context.getRenderContext(), 0, 0, renderedFrame.getAccess());

					// expect white
					if (!checkSurface(renderedFrame, tcu::RGBA::white()))
					{
						TCU_FAIL("StateInteraction failed; surface should be white");
					}
				}
				else
				{
					// Mismatched input and output variables
					// For OpenGL ES contexts, this should cause a validation failure
					// For OpenGL contexts, validation should succeed.
					if (glu::isContextTypeES(m_context.getRenderContext().getType()) != (value == 0))
					{
						log << TestLog::Message << "Mismatched input and output variables; validation should "
							<< (glu::isContextTypeES(m_context.getRenderContext().getType()) ? "fail.\n" : "succeed.\n")
							<< "Vertex Shader:\n"
							<< vtx << "Fragment Shader:\n"
							<< frag << TestLog::EndMessage;
						TCU_FAIL("StateInteraction failed");
					}
				}

				gl.deleteProgram(programA);
				gl.deleteProgram(programB);
			}
		}

		gl.bindProgramPipeline(0);
		gl.bindVertexArray(0);
		gl.deleteProgramPipelines(1, &pipeline);
		gl.deleteShader(vshader);
		gl.deleteVertexArrays(1, &vao);
		gl.deleteBuffers(1, &indexBuf);
		gl.deleteBuffers(1, &vertexBuf);

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}